

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_input_sse
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long *in_RSI;
  long *in_RDI;
  float r0tm3;
  float r0tm2;
  float r0tm1;
  float r0tm0;
  float tmp03;
  float tmp02;
  float tmp01;
  float tmp00;
  int m_3;
  float *r0_tm_3;
  float *r0_tm_2;
  float *r0_tm_1;
  float *r0_tm_0;
  float tmp3m;
  float tmp2m;
  float tmp1m;
  float tmp0m;
  float r03;
  float r02;
  float r01;
  float r00;
  int m_2;
  float *r0;
  int j;
  int i;
  float tmp [4] [4];
  Mat img0_tm;
  Mat img0;
  int q;
  int tiles;
  int h_tiles;
  int w_tiles;
  int inch;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  int local_314;
  float *local_310;
  float *local_308;
  float *local_300;
  float *local_2f8;
  int local_2cc;
  float *local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8 [8];
  float afStack_298 [4];
  float afStack_288 [10];
  void *local_260;
  int *local_258;
  ulong local_250;
  undefined4 local_248;
  long *local_240;
  int local_238;
  int local_234;
  int local_230;
  undefined4 local_22c;
  undefined4 local_228;
  ulong local_220;
  void *local_218;
  int *local_210;
  ulong local_208;
  undefined4 local_200;
  long *local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  ulong local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  long *local_1a8;
  long *local_1a0;
  void **local_198;
  void **local_188;
  int local_168;
  undefined4 local_164;
  void **local_160;
  int local_148;
  undefined4 local_144;
  void **local_140;
  undefined1 local_135;
  int local_134;
  long *local_130;
  void **local_128;
  void **local_108;
  int local_fc;
  void **local_f8;
  undefined1 local_ed;
  int local_ec;
  long *local_e8;
  void **local_e0;
  void *local_b0;
  void *local_a0;
  long *local_90;
  undefined4 local_84;
  ulong local_80;
  void *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  void **local_60;
  long *local_58;
  undefined4 local_4c;
  ulong local_48;
  void *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  void **local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_1b4 = *(int *)((long)in_RDI + 0x2c);
  local_1b8 = (int)in_RDI[6];
  local_1bc = (int)in_RDI[7];
  local_1c0 = (*(int *)((long)in_RDI + 0x2c) + -2) / 2;
  local_1c4 = ((int)in_RDI[6] + -2) / 2;
  local_1c8 = local_1c0 * local_1c4;
  local_1a8 = in_RSI;
  local_1a0 = in_RDI;
  for (local_1cc = 0; local_1cc < local_1bc; local_1cc = local_1cc + 1) {
    local_e0 = &local_218;
    local_e8 = local_1a0;
    local_ec = local_1cc;
    local_64 = *(int *)((long)local_1a0 + 0x2c);
    local_68 = (int)local_1a0[6];
    local_6c = *(undefined4 *)((long)local_1a0 + 0x34);
    local_78 = (void *)(*local_1a0 + local_1a0[8] * (long)local_1cc * local_1a0[2]);
    local_80 = local_1a0[2];
    local_84 = (undefined4)local_1a0[3];
    local_90 = (long *)local_1a0[4];
    local_60 = &local_218;
    local_218 = local_78;
    local_210 = (int *)0x0;
    local_208 = local_80;
    local_200 = local_84;
    local_1f8 = local_90;
    local_1ec = local_64;
    local_1e8 = local_68;
    local_1e4 = 1;
    local_1e0 = local_6c;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_c = 0x10;
    local_1d8 = (local_8 + 0xfU & 0xfffffffffffffff0) / local_80;
    local_1f0 = (int)local_1a0[5] + -1;
    if ((int)local_1a0[5] == 4) {
      local_1d8 = (long)*(int *)((long)local_1a0 + 0x2c) * (long)(int)local_1a0[6];
    }
    local_ed = 1;
    local_128 = &local_260;
    local_130 = local_1a8;
    local_134 = local_1cc;
    local_2c = *(int *)((long)local_1a8 + 0x2c);
    local_30 = (int)local_1a8[6];
    local_34 = *(undefined4 *)((long)local_1a8 + 0x34);
    local_40 = (void *)(*local_1a8 + local_1a8[8] * (long)local_1cc * local_1a8[2]);
    local_48 = local_1a8[2];
    local_4c = (undefined4)local_1a8[3];
    local_58 = (long *)local_1a8[4];
    local_28 = &local_260;
    local_260 = local_40;
    local_258 = (int *)0x0;
    local_250 = local_48;
    local_248 = local_4c;
    local_240 = local_58;
    local_234 = local_2c;
    local_230 = local_30;
    local_22c = 1;
    local_228 = local_34;
    local_18 = (long)local_2c * (long)local_30 * local_48;
    local_1c = 0x10;
    local_220 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_48;
    local_238 = (int)local_1a8[5] + -1;
    if ((int)local_1a8[5] == 4) {
      local_220 = (long)*(int *)((long)local_1a8 + 0x2c) * (long)(int)local_1a8[6];
    }
    local_135 = 1;
    local_c = 0x10;
    local_1c = 0x10;
    local_ed = 1;
    local_135 = 1;
    for (local_2bc = 0; local_2bc < local_1c4; local_2bc = local_2bc + 1) {
      for (local_2c0 = 0; local_2c0 < local_1c0; local_2c0 = local_2c0 + 1) {
        local_f8 = &local_218;
        local_fc = local_2bc << 1;
        local_2c8 = (float *)((long)local_218 +
                             (long)(local_2c0 << 1) * 4 +
                             (long)local_1ec * (long)(local_2bc << 1) * local_208);
        for (local_2cc = 0; local_2cc < 4; local_2cc = local_2cc + 1) {
          fVar1 = local_2c8[1];
          fVar2 = local_2c8[2];
          fVar3 = local_2c8[3];
          local_2b8[local_2cc] = *local_2c8 - fVar2;
          local_2b8[(long)local_2cc + 4] = fVar1 + fVar2;
          afStack_298[local_2cc] = fVar2 - fVar1;
          afStack_288[local_2cc] = fVar3 - fVar1;
          local_2c8 = local_2c8 + local_1b4;
        }
        local_108 = &local_260;
        local_2f8 = (float *)((long)local_260 + (long)(local_2bc * local_1c0 + local_2c0) * 4);
        local_300 = local_2f8 + local_1c8;
        local_308 = local_2f8 + (local_1c8 << 1);
        local_310 = local_2f8 + local_1c8 * 3;
        for (local_314 = 0; local_314 < 4; local_314 = local_314 + 1) {
          fVar1 = local_2b8[(long)local_314 * 4 + 1];
          fVar2 = local_2b8[(long)local_314 * 4 + 2];
          fVar3 = local_2b8[(long)local_314 * 4 + 3];
          *local_2f8 = local_2b8[(long)local_314 * 4] - fVar2;
          *local_300 = fVar1 + fVar2;
          *local_308 = fVar2 - fVar1;
          *local_310 = fVar3 - fVar1;
          local_2f8 = local_2f8 + (local_1c8 << 2);
          local_300 = local_300 + (local_1c8 << 2);
          local_308 = local_308 + (local_1c8 << 2);
          local_310 = local_310 + (local_1c8 << 2);
        }
      }
    }
    local_198 = &local_260;
    local_140 = &local_260;
    if (local_258 != (int *)0x0) {
      local_144 = 0xffffffff;
      LOCK();
      local_148 = *local_258;
      *local_258 = *local_258 + -1;
      UNLOCK();
      if (local_148 == 1) {
        if (local_240 == (long *)0x0) {
          local_b0 = local_260;
          if (local_260 != (void *)0x0) {
            free(local_260);
          }
        }
        else {
          (**(code **)(*local_240 + 0x18))(local_240,local_260);
        }
      }
    }
    local_260 = (void *)0x0;
    local_250 = 0;
    local_248 = 0;
    local_238 = 0;
    local_234 = 0;
    local_230 = 0;
    local_22c = 0;
    local_228 = 0;
    local_220 = 0;
    local_258 = (int *)0x0;
    local_188 = &local_218;
    local_160 = &local_218;
    if (local_210 != (int *)0x0) {
      local_164 = 0xffffffff;
      LOCK();
      local_168 = *local_210;
      *local_210 = *local_210 + -1;
      UNLOCK();
      if (local_168 == 1) {
        if (local_1f8 == (long *)0x0) {
          local_a0 = local_218;
          if (local_218 != (void *)0x0) {
            free(local_218);
          }
        }
        else {
          (**(code **)(*local_1f8 + 0x18))(local_1f8,local_218);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_input_sse(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 2;
    const int h_tiles = (h - 2) / 2;
    const int tiles = w_tiles * h_tiles;

    // const float itm[4][4] = {
    //     {1.0f,  0.0f, -1.0f,  0.0f},
    //     {0.0f,  1.0f,  1.00f, 0.0f},
    //     {0.0f, -1.0f,  1.00f, 0.0f},
    //     {0.0f, -1.0f,  0.00f, 1.0f}
    // };

    // 0 = r00 - r02
    // 1 = r01 + r02
    // 2 = r02 - r01
    // 3 = r03 - r01

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

        float tmp[4][4];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 2) + (j * 2);

                for (int m = 0; m < 4; m++)
                {
                    float r00 = r0[0];
                    float r01 = r0[1];
                    float r02 = r0[2];
                    float r03 = r0[3];

                    float tmp0m = r00 - r02;
                    float tmp1m = r01 + r02;
                    float tmp2m = r02 - r01;
                    float tmp3m = r03 - r01;

                    tmp[0][m] = tmp0m;
                    tmp[1][m] = tmp1m;
                    tmp[2][m] = tmp2m;
                    tmp[3][m] = tmp3m;

                    r0 += w;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j);
                float* r0_tm_1 = r0_tm_0 + tiles;
                float* r0_tm_2 = r0_tm_0 + tiles * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 3;

                for (int m = 0; m < 4; m++)
                {
                    float tmp00 = tmp[m][0];
                    float tmp01 = tmp[m][1];
                    float tmp02 = tmp[m][2];
                    float tmp03 = tmp[m][3];

                    float r0tm0 = tmp00 - tmp02;
                    float r0tm1 = tmp01 + tmp02;
                    float r0tm2 = tmp02 - tmp01;
                    float r0tm3 = tmp03 - tmp01;

                    r0_tm_0[0] = r0tm0;
                    r0_tm_1[0] = r0tm1;
                    r0_tm_2[0] = r0tm2;
                    r0_tm_3[0] = r0tm3;

                    r0_tm_0 += tiles * 4;
                    r0_tm_1 += tiles * 4;
                    r0_tm_2 += tiles * 4;
                    r0_tm_3 += tiles * 4;
                }
            }
        }
    }
}